

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackMemory::StackMemory(StackMemory *this,VMContext *context)

{
  uint8_t *puVar1;
  StackPage *pSVar2;
  StackPage *local_38;
  StackPage *page;
  size_t i;
  VMContext *local_18;
  VMContext *context_local;
  StackMemory *this_local;
  
  this->context = context;
  local_18 = context;
  context_local = (VMContext *)this;
  std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::vector
            (&this->stackPages);
  std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::vector(&this->freePages)
  ;
  StackFrame::StackFrame(&this->stackFrame,(uint8_t *)0x0,(uint8_t *)0x0);
  this->stackSize = 0x20000;
  puVar1 = (uint8_t *)operator_new__(this->stackSize);
  this->stackMemoryLowest = puVar1;
  this->stackMemoryHighest = this->stackMemoryLowest + this->stackSize;
  for (page = (StackPage *)0x0; page < (StackPage *)0x10;
      page = (StackPage *)((long)&page->context + 1)) {
    pSVar2 = (StackPage *)operator_new(0x58);
    StackPage::StackPage(pSVar2,local_18,this->stackMemoryLowest + (long)page * 0x2000);
    local_38 = pSVar2;
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->stackPages,&local_38);
    std::vector<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>::push_back
              (&this->freePages,&local_38);
  }
  pSVar2 = allocatePage(this);
  this->currentPage = pSVar2;
  StackPage::startUsing(this->currentPage);
  pSVar2 = this->currentPage;
  (this->stackFrame).framePointer = (pSVar2->headFrame).framePointer;
  (this->stackFrame).stackPointer = (pSVar2->headFrame).stackPointer;
  return;
}

Assistant:

StackMemory::StackMemory(VMContext *context)
    : context(context)
{
    stackSize = StackMemoryPageSize*StackPageCount;
    stackMemoryLowest = new uint8_t[stackSize];
    stackMemoryHighest = stackMemoryLowest + stackSize;

    for (size_t i = 0; i < StackPageCount; ++i)
    {
        auto page = new StackPage(context, stackMemoryLowest + i*StackMemoryPageSize);
        stackPages.push_back(page);
        freePages.push_back(page);
    }

    currentPage = allocatePage();
    currentPage->startUsing();
    stackFrame = currentPage->headFrame;
}